

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O2

uint64_t yactfr::internal::anon_unknown_0::readFlUIntLe33At6(uint8_t *buf)

{
  return ((ulong)(*(ushort *)(buf + 3) & 0x7fff) << 0x12 | (ulong)buf[2] << 10) + (ulong)buf[1] * 4
         | (ulong)(*buf >> 6);
}

Assistant:

std::uint64_t readFlUIntLe33At6(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[4];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[1];
    res <<= 2;
    res |= (buf[0] >> 6);
    res &= UINT64_C(0x1ffffffff);
    return res;
}